

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasyBox::ChBodyEasyBox
          (ChBodyEasyBox *this,double Xsize,double Ysize,double Zsize,double density,
          shared_ptr<chrono::ChMaterialSurface> *material,ChCollisionSystemType collision_type)

{
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  (this->super_ChBody).super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  ChBody::ChBody(&this->super_ChBody,&PTR_construction_vtable_24__01153140,collision_type);
  (this->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj = (_func_int **)0x1152be0;
  (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
  _vptr_ChFrame = (_func_int **)0x1152ee0;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChContactable._vptr_ChContactable =
       (_func_int **)0x1152f78;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  (this->super_ChBody).super_ChLoadableUVW = (ChLoadableUVW)0x11530b0;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  SetupBody(this,Xsize,Ysize,Zsize,density,true,true,
            (shared_ptr<chrono::ChMaterialSurface> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

ChBodyEasyBox::ChBodyEasyBox(double Xsize,
                             double Ysize,
                             double Zsize,
                             double density,
                             std::shared_ptr<ChMaterialSurface> material,
                             collision::ChCollisionSystemType collision_type)
    : ChBody(collision_type) {
    SetupBody(Xsize, Ysize, Zsize, density, true, true, material);
}